

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O3

int mixed_load_plugin(char *file)

{
  int iVar1;
  size_t sVar2;
  undefined8 *element;
  void *pvVar3;
  code *pcVar4;
  
  sVar2 = strlen(file);
  element = (undefined8 *)(*mixed_calloc)(1,0x10);
  if (element == (undefined8 *)0x0) {
    mixed_err(1);
    pvVar3 = (void *)0x0;
    goto LAB_00127c64;
  }
  pvVar3 = (*mixed_calloc)((ulong)((int)sVar2 + 1),1);
  *element = pvVar3;
  if (pvVar3 == (void *)0x0) {
    mixed_err(1);
LAB_00127c44:
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = open_library(file);
    if (pvVar3 == (void *)0x0) goto LAB_00127c44;
    pcVar4 = (code *)load_symbol(pvVar3,"mixed_make_plugin");
    if ((pcVar4 != (code *)0x0) && (iVar1 = (*pcVar4)(mixed_register_segment), iVar1 != 0)) {
      memcpy((void *)*element,file,sVar2 & 0xffffffff);
      element[1] = pvVar3;
      iVar1 = vector_add(element,(vector *)&plugins);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  if ((void *)*element != (void *)0x0) {
    (*mixed_free)((void *)*element);
  }
  (*mixed_free)(element);
LAB_00127c64:
  close_library(pvVar3);
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_load_plugin(const char *file){
  struct plugin_entry *entry = 0;
  void *handle = 0;
  uint32_t length = strlen(file);

  entry = mixed_calloc(1, sizeof(struct plugin_entry));
  if(!entry){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }
  
  entry->file = mixed_calloc(length+1, 1);
  if(!entry->file){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }

  handle = open_library(file);
  if(!handle) goto cleanup;
  
  mixed_make_plugin_function function;
  *(void **)(&function) = load_symbol(handle, "mixed_make_plugin");
  if(!function) goto cleanup;

  if(!function(mixed_register_segment)){
    goto cleanup;
  }

  memcpy(entry->file, file, length);
  entry->handle = handle;
  if(!vector_add(entry, (struct vector *)&plugins)){
    goto cleanup;
  }
  
  return 1;

 cleanup:
  if(entry){
    if(entry->file)
      mixed_free(entry->file);
    mixed_free(entry);
  }
  close_library(handle);
  return 0;
}